

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

CURLcode formdata_add_filename(curl_httppost *file,FormData **form,curl_off_t *size)

{
  char cVar1;
  curl_malloc_callback p_Var2;
  curl_strdup_callback p_Var3;
  CURLcode CVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  
  if (file->showfilename == (char *)0x0) {
    pcVar9 = (*Curl_cstrdup)(file->contents);
    p_Var3 = Curl_cstrdup;
    if (pcVar9 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = __xpg_basename(pcVar9);
      pcVar5 = (*p_Var3)(pcVar5);
      (*Curl_cfree)(pcVar9);
    }
    pcVar9 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar5 = (char *)0x0;
    pcVar9 = file->showfilename;
  }
  pcVar6 = strchr(pcVar9,0x5c);
  if ((pcVar6 == (char *)0x0) && (pcVar6 = strchr(pcVar9,0x22), pcVar6 == (char *)0x0)) {
    pcVar6 = (char *)0x0;
    goto LAB_00516550;
  }
  p_Var2 = Curl_cmalloc;
  sVar7 = strlen(pcVar9);
  pcVar6 = (char *)(*p_Var2)(sVar7 * 2 + 1);
  pcVar8 = pcVar6;
  if (pcVar6 != (char *)0x0) {
    do {
      cVar1 = *pcVar9;
      if ((cVar1 == '\"') || (cVar1 == '\\')) {
        *pcVar8 = '\\';
        pcVar8 = pcVar8 + 1;
      }
      else if (cVar1 == '\0') goto LAB_0051652d;
      cVar1 = *pcVar9;
      pcVar9 = pcVar9 + 1;
      *pcVar8 = cVar1;
      pcVar8 = pcVar8 + 1;
    } while( true );
  }
  (*Curl_cfree)(pcVar5);
LAB_00516541:
  if (pcVar6 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
LAB_00516550:
  CVar4 = AddFormDataf(form,size,"; filename=\"%s\"",pcVar9);
  (*Curl_cfree)(pcVar6);
  (*Curl_cfree)(pcVar5);
  return CVar4;
LAB_0051652d:
  *pcVar8 = '\0';
  pcVar9 = pcVar6;
  goto LAB_00516541;
}

Assistant:

static CURLcode formdata_add_filename(const struct curl_httppost *file,
                                      struct FormData **form,
                                      curl_off_t *size)
{
  CURLcode result = CURLE_OK;
  char *filename = file->showfilename;
  char *filebasename = NULL;
  char *filename_escaped = NULL;

  if(!filename) {
    filebasename = strippath(file->contents);
    if(!filebasename)
      return CURLE_OUT_OF_MEMORY;
    filename = filebasename;
  }

  if(strchr(filename, '\\') || strchr(filename, '"')) {
    char *p0, *p1;

    /* filename need be escaped */
    filename_escaped = malloc(strlen(filename)*2+1);
    if(!filename_escaped) {
      free(filebasename);
      return CURLE_OUT_OF_MEMORY;
    }
    p0 = filename_escaped;
    p1 = filename;
    while(*p1) {
      if(*p1 == '\\' || *p1 == '"')
        *p0++ = '\\';
      *p0++ = *p1++;
    }
    *p0 = '\0';
    filename = filename_escaped;
  }
  result = AddFormDataf(form, size,
                        "; filename=\"%s\"",
                        filename);
  free(filename_escaped);
  free(filebasename);
  return result;
}